

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_printf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zIn;
  jx9_int64 nCounter;
  int nLen;
  
  nCounter = 0;
  if (((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) &&
     (zIn = jx9_value_to_string(*apArg,&nLen), 0 < nLen)) {
    jx9InputFormat(printfConsumer,pCtx,zIn,nLen,nArg,apArg,&nCounter,0);
    jx9_result_int64(pCtx,nCounter);
    return 0;
  }
  jx9_result_int(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_printf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nCounter = 0;
	const char *zFormat;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Format the string */
	jx9InputFormat(printfConsumer, pCtx, zFormat, nLen, nArg, apArg, (void *)&nCounter, FALSE);
	/* Return the length of the outputted string */
	jx9_result_int64(pCtx, nCounter);
	return JX9_OK;
}